

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   unsigned_long params_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
                   unsigned_long params_3)

{
  string *in_RCX;
  string *in_RDI;
  string *in_R8;
  unsigned_long in_R9;
  string *in_stack_00000008;
  value_type *in_stack_fffffffffffffec8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_fffffffffffffed0;
  string local_d8 [32];
  string local_b8 [48];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  unsigned_long in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  
  ::std::__cxx11::string::string(local_88,in_RCX);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>(in_RDI);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0xc068ef);
  ::std::__cxx11::string::~string(local_88);
  ::std::__cxx11::string::string(local_b8,in_R8);
  ::std::__cxx11::string::string(local_d8,in_stack_00000008);
  ConstructMessageRecursive<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_R9);
  ::std::__cxx11::string::~string(local_d8);
  ::std::__cxx11::string::~string(local_b8);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}